

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O0

void __thiscall ClassBundle::updateField(ClassBundle *this,Field *field)

{
  undefined1 local_80 [56];
  FieldType type;
  Field *field_local;
  ClassBundle *this_local;
  
  type.templateTypes.super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)field;
  FieldType::FieldType((FieldType *)(local_80 + 0x30),&field->type);
  updateFieldType(this,(FieldType *)(local_80 + 0x30));
  FieldType::getName_abi_cxx11_((FieldType *)local_80);
  std::__cxx11::string::operator=
            ((string *)
             type.templateTypes.super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  FieldType::~FieldType((FieldType *)(local_80 + 0x30));
  return;
}

Assistant:

void updateField(Field &field) {
        FieldType type(field.type);
//        type.Debug();

        this->updateFieldType(type);

        field.type = type.getName();
    }